

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_vss2.cpp
# Opt level: O0

void __thiscall edk2_vss2_t::_read(edk2_vss2_t *this)

{
  uint8_t uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  int32_t iVar5;
  validation_expr_error<unsigned_int> *this_00;
  kstream *pkVar6;
  vss2_store_body_t *this_01;
  pointer p__io;
  unique_ptr<edk2_vss2_t::vss2_store_body_t,_std::default_delete<edk2_vss2_t::vss2_store_body_t>_>
  local_a0;
  unique_ptr<kaitai::kstream,std::default_delete<kaitai::kstream>> local_98 [8];
  string local_90;
  undefined1 local_6a;
  allocator local_69;
  string local_68;
  uint32_t local_38;
  uint32_t local_34;
  undefined1 local_30 [4];
  uint32_t _;
  edk2_vss2_t *local_10;
  edk2_vss2_t *this_local;
  
  local_10 = this;
  kaitai::kstream::read_bytes_abi_cxx11_((string *)local_30,(this->super_kstruct).m__io,0x10);
  std::__cxx11::string::operator=((string *)&this->m_signature,(string *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_vss2_size = uVar3;
  uVar3 = vss2_size(this);
  local_34 = uVar3;
  uVar4 = len_vss2_store_header(this);
  if ((uVar4 < uVar3) && (local_34 != 0xffffffff)) {
    uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_format = uVar1;
    uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_state = uVar1;
    uVar2 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
    this->m_reserved = uVar2;
    uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
    this->m_reserved1 = uVar3;
    pkVar6 = (this->super_kstruct).m__io;
    uVar3 = vss2_size(this);
    iVar5 = len_vss2_store_header(this);
    kaitai::kstream::read_bytes_abi_cxx11_(&local_90,pkVar6,(ulong)(uVar3 - iVar5));
    std::__cxx11::string::operator=((string *)&this->m__raw_body,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    pkVar6 = (kstream *)operator_new(0x198);
    kaitai::kstream::kstream(pkVar6,&this->m__raw_body);
    std::unique_ptr<kaitai::kstream,std::default_delete<kaitai::kstream>>::
    unique_ptr<std::default_delete<kaitai::kstream>,void>(local_98,pkVar6);
    std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::operator=
              (&this->m__io__raw_body,
               (unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_> *)local_98);
    std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::~unique_ptr
              ((unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_> *)local_98);
    this_01 = (vss2_store_body_t *)operator_new(0x28);
    p__io = std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::get
                      (&this->m__io__raw_body);
    vss2_store_body_t::vss2_store_body_t(this_01,p__io,this,this->m__root);
    std::
    unique_ptr<edk2_vss2_t::vss2_store_body_t,std::default_delete<edk2_vss2_t::vss2_store_body_t>>::
    unique_ptr<std::default_delete<edk2_vss2_t::vss2_store_body_t>,void>
              ((unique_ptr<edk2_vss2_t::vss2_store_body_t,std::default_delete<edk2_vss2_t::vss2_store_body_t>>
                *)&local_a0,this_01);
    std::
    unique_ptr<edk2_vss2_t::vss2_store_body_t,_std::default_delete<edk2_vss2_t::vss2_store_body_t>_>
    ::operator=(&this->m_body,&local_a0);
    std::
    unique_ptr<edk2_vss2_t::vss2_store_body_t,_std::default_delete<edk2_vss2_t::vss2_store_body_t>_>
    ::~unique_ptr(&local_a0);
    return;
  }
  local_6a = 1;
  this_00 = (validation_expr_error<unsigned_int> *)__cxa_allocate_exception(0x40);
  local_38 = vss2_size(this);
  pkVar6 = kaitai::kstruct::_io(&this->super_kstruct);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"/seq/1",&local_69);
  kaitai::validation_expr_error<unsigned_int>::validation_expr_error
            (this_00,&local_38,pkVar6,&local_68);
  local_6a = 0;
  __cxa_throw(this_00,&kaitai::validation_expr_error<unsigned_int>::typeinfo,
              kaitai::validation_expr_error<unsigned_int>::~validation_expr_error);
}

Assistant:

void edk2_vss2_t::_read() {
    m_signature = m__io->read_bytes(16);
    m_vss2_size = m__io->read_u4le();
    {
        uint32_t _ = vss2_size();
        if (!( ((_ > static_cast<uint32_t>(len_vss2_store_header())) && (_ < 4294967295UL)) )) {
            throw kaitai::validation_expr_error<uint32_t>(vss2_size(), _io(), std::string("/seq/1"));
        }
    }
    m_format = m__io->read_u1();
    m_state = m__io->read_u1();
    m_reserved = m__io->read_u2le();
    m_reserved1 = m__io->read_u4le();
    m__raw_body = m__io->read_bytes((vss2_size() - len_vss2_store_header()));
    m__io__raw_body = std::unique_ptr<kaitai::kstream>(new kaitai::kstream(m__raw_body));
    m_body = std::unique_ptr<vss2_store_body_t>(new vss2_store_body_t(m__io__raw_body.get(), this, m__root));
}